

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmocka.c
# Opt level: O0

void free_symbol_map_value(void *value,void *cleanup_value_data)

{
  ListNode *in_RSI;
  char *in_RDI;
  unsigned_long children;
  SymbolMapValue *map_value;
  undefined4 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  
  _assert_true((unsigned_long)in_RSI,in_RDI,(char *)in_RSI,in_stack_ffffffffffffffdc);
  list_free(in_RSI,(CleanupListValue)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
            (void *)0x173581);
  free(in_RDI);
  return;
}

Assistant:

static void free_symbol_map_value(const void *value,
                                  void *cleanup_value_data) {
    SymbolMapValue * const map_value = (SymbolMapValue*)value;
    const LargestIntegralType children = cast_ptr_to_largest_integral_type(cleanup_value_data);
    assert_non_null(value);
    list_free(&map_value->symbol_values_list_head,
              children ? free_symbol_map_value : free_value,
              (void *) ((uintptr_t)children - 1));
    free(map_value);
}